

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int iVar2;
  AssertionExpr *this;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  long lVar3;
  AssertionExpr *clocking;
  AssertionExpr *disable;
  AssertionExpr *result;
  bool allowDisable;
  undefined1 local_50 [8];
  ASTContext ctx;
  ASTContext *context_local;
  PropertySpecSyntax *syntax_local;
  
  lVar3 = CONCAT44(in_register_0000003c,__fd);
  ctx.assertionInstance = (AssertionInstanceDetails *)__addr;
  memcpy(local_50,__addr,0x38);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffa8,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=
            ((bitmask<slang::ast::ASTFlags> *)&ctx.lookupIndex,
             (bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffa8);
  lVar1 = *(long *)(lVar3 + 0x18);
  this = (AssertionExpr *)
         not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                   ((not_null<slang::syntax::PropertyExprSyntax_*> *)(lVar3 + 0x20));
  iVar2 = bind(this,(int)ctx.assertionInstance,(sockaddr *)(ulong)(lVar1 == 0),0);
  disable = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
  if (*(long *)(lVar3 + 0x18) != 0) {
    disable = DisableIffAssertionExpr::fromSyntax
                        (*(DisableIffSyntax **)(lVar3 + 0x18),disable,
                         (ASTContext *)ctx.assertionInstance);
    disable->syntax = *(SyntaxNode **)(lVar3 + 0x18);
  }
  if (*(long *)(lVar3 + 0x10) != 0) {
    disable = ClockingAssertionExpr::fromSyntax
                        (*(TimingControlSyntax **)(lVar3 + 0x10),disable,
                         (ASTContext *)ctx.assertionInstance);
    disable->syntax = *(SyntaxNode **)(lVar3 + 0x10);
  }
  return (int)disable;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertySpecSyntax& syntax,
                                         const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    bool allowDisable = syntax.disable == nullptr;
    auto result = &bind(*syntax.expr, context, allowDisable);

    if (syntax.disable) {
        auto& disable = DisableIffAssertionExpr::fromSyntax(*syntax.disable, *result, context);
        disable.syntax = syntax.disable;
        result = &disable;
    }

    if (syntax.clocking) {
        auto& clocking = ClockingAssertionExpr::fromSyntax(*syntax.clocking, *result, context);
        clocking.syntax = syntax.clocking;
        result = &clocking;
    }

    return *result;
}